

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuLayoutItem>::emplace<QDBusMenuLayoutItem_const&>
          (QMovableArrayOps<QDBusMenuLayoutItem> *this,qsizetype i,QDBusMenuLayoutItem *args)

{
  QDBusMenuLayoutItem **ppQVar1;
  qsizetype *pqVar2;
  QDBusMenuLayoutItem *pQVar3;
  int iVar4;
  Data *pDVar5;
  QDBusMenuLayoutItem *pQVar6;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QDBusMenuLayoutItem tmp;
  QVariantMap QStack_60;
  QArrayDataPointer<QDBusMenuLayoutItem> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
           super_QArrayDataPointer<QDBusMenuLayoutItem>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0063c415:
    iVar4 = args->m_id;
    QStack_60.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(args->m_properties).d.d.ptr;
    if (QStack_60.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
         )0x0) {
      LOCK();
      *(int *)QStack_60.d.d.ptr = *(int *)QStack_60.d.d.ptr + 1;
      UNLOCK();
    }
    local_58.d = (args->m_children).d.d;
    local_58.ptr = (args->m_children).d.ptr;
    local_58.size = (args->m_children).d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar8 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
            super_QArrayDataPointer<QDBusMenuLayoutItem>.size != 0;
    QArrayDataPointer<QDBusMenuLayoutItem>::detachAndGrow
              ((QArrayDataPointer<QDBusMenuLayoutItem> *)this,(uint)(i == 0 && bVar8),1,
               (QDBusMenuLayoutItem **)0x0,(QArrayDataPointer<QDBusMenuLayoutItem> *)0x0);
    pQVar6 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
             super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr;
    if (i == 0 && bVar8) {
      pQVar6[-1].m_id = iVar4;
      pQVar6[-1].m_properties.d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)QStack_60.d.d.ptr;
      pQVar6[-1].m_children.d.d = local_58.d;
      pQVar6[-1].m_children.d.ptr = local_58.ptr;
      pQVar6[-1].m_children.d.size = local_58.size;
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                 super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      pQVar3 = pQVar6 + i;
      memmove(pQVar3 + 1,pQVar6 + i,
              ((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
               super_QArrayDataPointer<QDBusMenuLayoutItem>.size - i) * 0x28);
      pQVar3->m_id = iVar4;
      (pQVar3->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)QStack_60.d.d.ptr;
      (pQVar3->m_children).d.d = local_58.d;
      (pQVar3->m_children).d.ptr = local_58.ptr;
      (pQVar3->m_children).d.size = local_58.size;
    }
    local_58.size = 0;
    local_58.ptr = (QDBusMenuLayoutItem *)0x0;
    local_58.d = (Data *)0x0;
    QStack_60.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
              super_QArrayDataPointer<QDBusMenuLayoutItem>.size;
    *pqVar2 = *pqVar2 + 1;
    QArrayDataPointer<QDBusMenuLayoutItem>::~QArrayDataPointer(&local_58);
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&QStack_60.d);
  }
  else {
    if (((this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
         super_QArrayDataPointer<QDBusMenuLayoutItem>.size == i) &&
       (pQVar6 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                 super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      pQVar6 = pQVar6 + i;
      pQVar6->m_id = args->m_id;
      pQVar7 = (args->m_properties).d.d.ptr;
      (pQVar6->m_properties).d.d.ptr = pQVar7;
      if (pQVar7 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      pDVar5 = (args->m_children).d.d;
      (pQVar6->m_children).d.d = pDVar5;
      (pQVar6->m_children).d.ptr = (args->m_children).d.ptr;
      (pQVar6->m_children).d.size = (args->m_children).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pQVar6 = (this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                   super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr,
         (QDBusMenuLayoutItem *)
         ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar6))
      goto LAB_0063c415;
      pQVar6[-1].m_id = args->m_id;
      pQVar7 = (args->m_properties).d.d.ptr;
      pQVar6[-1].m_properties.d.d.ptr = pQVar7;
      if (pQVar7 != (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      pDVar5 = (args->m_children).d.d;
      pQVar6[-1].m_children.d.d = pDVar5;
      pQVar6[-1].m_children.d.ptr = (args->m_children).d.ptr;
      pQVar6[-1].m_children.d.size = (args->m_children).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
                 super_QArrayDataPointer<QDBusMenuLayoutItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuLayoutItem>).
              super_QArrayDataPointer<QDBusMenuLayoutItem>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }